

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryRegister.cpp
# Opt level: O0

void __thiscall
amrex::BndryRegister::define
          (BndryRegister *this,Orientation _face,IndexType _typ,int _in_rad,int _out_rad,
          int _extent_rad,int _ncomp,DistributionMapping *dmap)

{
  BoxArray *this_00;
  long in_RDI;
  Real in_stack_00000020;
  FabSet *in_stack_00000028;
  FabSet *fabs;
  BoxArray fsBA;
  int in_stack_fffffffffffffeec;
  undefined8 in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  Orientation local_4;
  
  this_00 = (BoxArray *)(in_RDI + 0x908);
  BATransformer::BATransformer
            ((BATransformer *)&stack0xffffffffffffff30,
             (Orientation)(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
             (IndexType)(uint)in_stack_ffffffffffffff00,(int)((ulong)this_00 >> 0x20),(int)this_00,
             in_stack_fffffffffffffeec);
  BoxArray::BoxArray((BoxArray *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (BoxArray *)in_stack_ffffffffffffff50,
                     (BATransformer *)in_stack_ffffffffffffff48);
  Orientation::operator_cast_to_int(&local_4);
  FabSet::define((FabSet *)in_stack_ffffffffffffff70,(BoxArray *)in_stack_ffffffffffffff68,
                 (DistributionMapping *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  FabSet::setVal(in_stack_00000028,in_stack_00000020);
  BoxArray::~BoxArray(this_00);
  return;
}

Assistant:

void
BndryRegister::define (Orientation _face,
                       IndexType   _typ,
                       int         _in_rad,
                       int         _out_rad,
                       int         _extent_rad,
                       int         _ncomp,
                       const DistributionMapping& dmap)
{
    BoxArray fsBA(grids, BATransformer(_face,_typ,_in_rad,_out_rad,_extent_rad));

    FabSet& fabs = bndry[_face];

    BL_ASSERT(fabs.size() == 0);

    fabs.define(fsBA,dmap,_ncomp);
    //
    // Go ahead and assign values to the boundary register fabs
    // since in some places APPLYBC (specifically in the tensor
    // operator) the boundary registers are used for a few calculations
    // before the masks are tested to see if you need them.
    //
    fabs.setVal(BL_SAFE_BOGUS);
}